

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

bool __thiscall absl::Mutex::TryLockSlow(Mutex *this)

{
  __atomic_base<long> _Var1;
  __atomic_base<long> local_68;
  intptr_t v;
  Mutex *this_local;
  ulong local_50;
  memory_order local_48;
  int local_44;
  memory_order __b;
  undefined1 local_31;
  ulong local_30;
  undefined4 local_28;
  undefined4 local_24;
  ulong local_20;
  __atomic_base<long> *local_18;
  Mutex *local_10;
  
  local_44 = 0;
  v = (intptr_t)this;
  ___b = this;
  local_48 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_44 - 1U < 2) {
    local_50 = (this->mu_).super___atomic_base<long>._M_i;
  }
  else if (local_44 == 5) {
    local_50 = (this->mu_).super___atomic_base<long>._M_i;
  }
  else {
    local_50 = (this->mu_).super___atomic_base<long>._M_i;
  }
  local_68._M_i = local_50;
  _Var1._M_i = local_68._M_i;
  if ((local_50 & 9) == 0) {
    local_30 = local_50 | 8;
    local_18 = &local_68;
    local_24 = 2;
    local_28 = 0;
    LOCK();
    _Var1._M_i = (this->mu_).super___atomic_base<long>._M_i;
    local_31 = local_50 == _Var1._M_i;
    if ((bool)local_31) {
      (this->mu_).super___atomic_base<long>._M_i = local_30;
      _Var1._M_i = local_50;
    }
    UNLOCK();
    local_20 = local_30;
    local_10 = this;
    if ((bool)local_31) {
      DebugOnlyLockEnter(this);
      PostSynchEvent(this,0);
      return true;
    }
  }
  local_68._M_i = _Var1._M_i;
  PostSynchEvent(this,1);
  return false;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE bool Mutex::TryLockSlow() {
  intptr_t v = mu_.load(std::memory_order_relaxed);
  if ((v & kExclusive->slow_need_zero) == 0 &&  // try fast acquire
      mu_.compare_exchange_strong(
          v, (kExclusive->fast_or | v) + kExclusive->fast_add,
          std::memory_order_acquire, std::memory_order_relaxed)) {
    DebugOnlyLockEnter(this);
    PostSynchEvent(this, SYNCH_EV_TRYLOCK_SUCCESS);
    ABSL_TSAN_MUTEX_POST_LOCK(this, __tsan_mutex_try_lock, 0);
    return true;
  }
  PostSynchEvent(this, SYNCH_EV_TRYLOCK_FAILED);
  ABSL_TSAN_MUTEX_POST_LOCK(
      this, __tsan_mutex_try_lock | __tsan_mutex_try_lock_failed, 0);
  return false;
}